

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupInvMiter(Gia_Man_t *p,Gia_Man_t *pInv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  ulong uVar7;
  int iVar8;
  
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43c,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  if (pInv->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pInv) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43d,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  if (pInv->vCos->nSize != 1) {
    __assert_fail("Gia_ManCoNum(pInv) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43e,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  if (p->nRegs != pInv->vCis->nSize) {
    __assert_fail("Gia_ManRegNum(p) == Gia_ManCiNum(pInv)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x43f,"Gia_Man_t *Gia_ManDupInvMiter(Gia_Man_t *, Gia_Man_t *)");
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(pInv->nObjs * 2 + p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  for (iVar8 = 1; iVar8 < p->nObjs; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManObj(p,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar3 = (uint)*(ulong *)pGVar5;
    uVar7 = *(ulong *)pGVar5 & 0x1fffffff;
    if (uVar7 == 0x1fffffff || (int)uVar3 < 0) {
      if ((~uVar3 & 0x9fffffff) == 0) {
        uVar3 = Gia_ManAppendCi(p_00);
        goto LAB_001d639b;
      }
      if ((int)uVar3 < 0 && (int)uVar7 != 0x1fffffff) {
        uVar3 = Gia_ObjFanin0Copy(pGVar5);
        goto LAB_001d639b;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pGVar5);
      iVar2 = Gia_ObjFanin1Copy(pGVar5);
      uVar3 = Gia_ManHashAnd(p_00,iVar1,iVar2);
LAB_001d639b:
      pGVar5->Value = uVar3;
    }
  }
  for (iVar8 = 0; iVar8 < p->nRegs; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar3 = pGVar5->Value;
    pGVar5 = Gia_ManCi(pInv,iVar8);
    pGVar5->Value = uVar3;
  }
  for (iVar8 = 0; iVar8 < pInv->nObjs; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManObj(pInv,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar1 = Gia_ObjFanin0Copy(pGVar5);
      iVar2 = Gia_ObjFanin1Copy(pGVar5);
      uVar3 = Gia_ManHashAnd(p_00,iVar1,iVar2);
      pGVar5->Value = uVar3;
    }
  }
  pGVar5 = Gia_ManCo(pInv,0);
  iVar8 = Gia_ObjFanin0Copy(pGVar5);
  for (iVar1 = 0; iVar1 < p->nRegs; iVar1 = iVar1 + 1) {
    pGVar5 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar3 = pGVar5->Value;
    pGVar5 = Gia_ManCi(pInv,iVar1);
    pGVar5->Value = uVar3;
  }
  for (iVar1 = 0; iVar1 < pInv->nObjs; iVar1 = iVar1 + 1) {
    pGVar5 = Gia_ManObj(pInv,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      iLit1 = Gia_ObjFanin1Copy(pGVar5);
      uVar3 = Gia_ManHashAnd(p_00,iVar2,iLit1);
      pGVar5->Value = uVar3;
    }
  }
  pGVar5 = Gia_ManCo(pInv,0);
  iVar1 = Gia_ObjFanin0Copy(pGVar5);
  iVar1 = Abc_LitNot(iVar1);
  iVar8 = Gia_ManHashAnd(p_00,iVar8,iVar1);
  Gia_ManAppendCo(p_00,iVar8);
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupInvMiter( Gia_Man_t * p, Gia_Man_t * pInv )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, Node1, Node2, Node;
    assert( Gia_ManRegNum(p) > 0 );
    assert( Gia_ManRegNum(pInv) == 0 );
    assert( Gia_ManCoNum(pInv) == 1 );
    assert( Gia_ManRegNum(p) == Gia_ManCiNum(pInv) );
    Gia_ManFillValue(p);
    pNew = Gia_ManStart( Gia_ManObjNum(p) + 2*Gia_ManObjNum(pInv) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
    }
    // build invariant on top of register outputs in the first frame
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManCi(pInv, i)->Value = pObj->Value;
    Gia_ManForEachAnd( pInv, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManCo( pInv, 0 );
    Node1 = Gia_ObjFanin0Copy(pObj);
    // build invariant on top of register outputs in the second frame
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManCi(pInv, i)->Value = pObj->Value;
    Gia_ManForEachAnd( pInv, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManCo( pInv, 0 );
    Node2 = Gia_ObjFanin0Copy(pObj);
    // create miter output
    Node = Gia_ManHashAnd( pNew, Node1, Abc_LitNot(Node2) );
    Gia_ManAppendCo( pNew, Node );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}